

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::Expect(WastParser *this,TokenType type)

{
  Location loc;
  _Alloc_hider _Var1;
  bool bVar2;
  Enum EVar3;
  char *pcVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  Token token;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  string local_80;
  Token local_60;
  
  bVar2 = Match(this,type);
  EVar3 = Ok;
  if (!bVar2) {
    Consume(&local_60,this);
    Token::to_string_clamp_abi_cxx11_(&local_80,&local_60,0x50);
    _Var1._M_p = local_80._M_dataplus._M_p;
    pcVar4 = GetTokenTypeName(type);
    uStack_a0 = (undefined4)local_60.loc.filename.size_;
    uStack_9c = (undefined4)(local_60.loc.filename.size_ >> 0x20);
    local_98 = local_60.loc.field_1._0_4_;
    uStack_94 = local_60.loc.field_1._4_4_;
    uStack_90 = (undefined4)local_60.loc.field_1._8_8_;
    uStack_8c = (undefined4)((ulong)local_60.loc.field_1._8_8_ >> 0x20);
    loc.filename.size_._0_4_ = uStack_a0;
    loc.filename.data_ = local_60.loc.filename.data_;
    loc.filename.size_._4_4_ = uStack_9c;
    loc.field_1.field_0.line = local_98;
    loc.field_1.field_0.first_column = uStack_94;
    loc.field_1.field_0.last_column = uStack_90;
    loc.field_1._12_4_ = uStack_8c;
    Error(this,loc,"unexpected token %s, expected %s.",_Var1._M_p,pcVar4,in_R8,in_R9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    EVar3 = Error;
  }
  return (Result)EVar3;
}

Assistant:

Result WastParser::Expect(TokenType type) {
  if (!Match(type)) {
    Token token = Consume();
    Error(token.loc, "unexpected token %s, expected %s.",
          token.to_string_clamp(kMaxErrorTokenLength).c_str(),
          GetTokenTypeName(type));
    return Result::Error;
  }

  return Result::Ok;
}